

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts3SelectDoctotal(Fts3Table *pTab,sqlite3_stmt **ppStmt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Mem *pMVar4;
  sqlite3_stmt *pStmt;
  long in_FS_OFFSET;
  sqlite3_stmt *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (sqlite3_stmt *)0x0;
  iVar2 = fts3SqlStmt(pTab,0x16,&local_30,(sqlite3_value **)0x0);
  pStmt = local_30;
  if (iVar2 == 0) {
    iVar2 = 0;
    sqlite3_bind_int64(local_30,1,0);
    iVar3 = sqlite3_step(pStmt);
    if (iVar3 == 100) {
      pMVar4 = columnMem(pStmt,0);
      uVar1._0_2_ = pMVar4->flags;
      uVar1._2_1_ = pMVar4->enc;
      uVar1._3_1_ = pMVar4->eSubtype;
      columnMallocFailure(pStmt);
      if ((0x1000000010001U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_001cb754;
    }
    iVar3 = sqlite3_reset(pStmt);
    iVar2 = 0x10b;
    if (iVar3 != 0) {
      iVar2 = iVar3;
    }
    pStmt = (sqlite3_stmt *)0x0;
  }
LAB_001cb754:
  *ppStmt = pStmt;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SelectDoctotal(
  Fts3Table *pTab,                /* Fts3 table handle */
  sqlite3_stmt **ppStmt           /* OUT: Statement handle */
){
  sqlite3_stmt *pStmt = 0;
  int rc;
  rc = fts3SqlStmt(pTab, SQL_SELECT_STAT, &pStmt, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
    if( sqlite3_step(pStmt)!=SQLITE_ROW
     || sqlite3_column_type(pStmt, 0)!=SQLITE_BLOB
    ){
      rc = sqlite3_reset(pStmt);
      if( rc==SQLITE_OK ) rc = FTS_CORRUPT_VTAB;
      pStmt = 0;
    }
  }
  *ppStmt = pStmt;
  return rc;
}